

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdash_reporter.c
# Opt level: O0

void print_measurement(CDashMemo *memo,char *message,__va_list_tag *arguments)

{
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  
  (**(code **)(in_RDI + 8))(*(undefined8 *)(in_RDI + 0x18),"       <Measurement>\n        <Value>");
  if (in_RSI == 0) {
    (**(code **)(in_RDI + 8))(*(undefined8 *)(in_RDI + 0x18),"Problem");
  }
  else {
    (**(code **)(in_RDI + 0x10))(*(undefined8 *)(in_RDI + 0x18),in_RSI,in_RDX);
  }
  (**(code **)(in_RDI + 8))(*(undefined8 *)(in_RDI + 0x18),"</Value>\n       </Measurement>\n");
  return;
}

Assistant:

static void print_measurement(CDashMemo *memo, const char* message, va_list arguments) {
    memo->printer(memo->stream,
                  "       <Measurement>\n"
                  "        <Value>");
    if (message == NULL) {
        memo->printer(memo->stream,
                      "Problem");
    } else {
        memo->vprinter(memo->stream,
                       message, arguments);
    }
    memo->printer(memo->stream,
                  "</Value>\n"
                  "       </Measurement>\n");
}